

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

int Cec_ManSimCompareEqualFirstBit(uint *p0,uint *p1,int nWords)

{
  int iVar1;
  int local_28;
  int w;
  int nWords_local;
  uint *p1_local;
  uint *p0_local;
  
  if ((*p0 & 1) == (*p1 & 1)) {
    for (local_28 = 0; local_28 < nWords; local_28 = local_28 + 1) {
      if (p0[local_28] != p1[local_28]) {
        iVar1 = Gia_WordFindFirstBit(p0[local_28] ^ p1[local_28]);
        return local_28 * 0x20 + iVar1;
      }
    }
  }
  else {
    for (local_28 = 0; local_28 < nWords; local_28 = local_28 + 1) {
      if (p0[local_28] != (p1[local_28] ^ 0xffffffff)) {
        iVar1 = Gia_WordFindFirstBit(p0[local_28] ^ p1[local_28] ^ 0xffffffff);
        return local_28 * 0x20 + iVar1;
      }
    }
  }
  return -1;
}

Assistant:

int Cec_ManSimCompareEqualFirstBit( unsigned * p0, unsigned * p1, int nWords )
{
    int w;
    if ( (p0[0] & 1) == (p1[0] & 1) )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != p1[w] )
                return 32*w + Gia_WordFindFirstBit( p0[w] ^ p1[w] );
        return -1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != ~p1[w] )
                return 32*w + Gia_WordFindFirstBit( p0[w] ^ ~p1[w] );
        return -1;
    }
}